

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommodoreTAP.cpp
# Opt level: O0

Pulse __thiscall Storage::Tape::CommodoreTAP::virtual_get_next_pulse(CommodoreTAP *this)

{
  Pulse PVar1;
  byte bVar2;
  bool bVar3;
  uint32_t local_24;
  uint8_t next_byte;
  uint32_t next_length;
  CommodoreTAP *this_local;
  undefined4 uStack_10;
  uint local_c;
  
  if ((this->is_at_end_ & 1U) == 0) {
    if ((this->current_pulse_).type == High) {
      bVar2 = FileHolder::get8(&this->file_);
      if (((this->updated_layout_ & 1U) == 0) || (bVar2 != 0)) {
        local_24 = (uint)bVar2 << 3;
      }
      else {
        local_24 = FileHolder::get24le(&this->file_);
      }
      bVar3 = FileHolder::eof(&this->file_);
      if (bVar3) {
        this->is_at_end_ = true;
        (this->current_pulse_).length.length = (this->current_pulse_).length.clock_rate;
        (this->current_pulse_).type = Zero;
      }
      else {
        (this->current_pulse_).length.length = local_24;
        (this->current_pulse_).type = Low;
      }
    }
    else {
      (this->current_pulse_).type = High;
    }
    this_local._4_4_ = (this->current_pulse_).type;
    uStack_10 = (this->current_pulse_).length.length;
    local_c = (this->current_pulse_).length.clock_rate;
  }
  else {
    this_local._4_4_ = (this->current_pulse_).type;
    uStack_10 = (this->current_pulse_).length.length;
    local_c = (this->current_pulse_).length.clock_rate;
  }
  PVar1.length.clock_rate = local_c;
  PVar1.type = this_local._4_4_;
  PVar1.length.length = uStack_10;
  return PVar1;
}

Assistant:

Storage::Tape::Tape::Pulse CommodoreTAP::virtual_get_next_pulse() {
	if(is_at_end_) {
		return current_pulse_;
	}

	if(current_pulse_.type == Pulse::High) {
		uint32_t next_length;
		uint8_t next_byte = file_.get8();
		if(!updated_layout_ || next_byte > 0) {
			next_length = uint32_t(next_byte) << 3;
		} else {
			next_length = file_.get24le();
		}

		if(file_.eof()) {
			is_at_end_ = true;
			current_pulse_.length.length = current_pulse_.length.clock_rate;
			current_pulse_.type = Pulse::Zero;
		} else {
			current_pulse_.length.length = next_length;
			current_pulse_.type = Pulse::Low;
		}
	} else {
		current_pulse_.type = Pulse::High;
	}

	return current_pulse_;
}